

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::UpdateViewportPlatformMonitor(ImGuiViewportP *viewport)

{
  undefined4 uVar1;
  ImVec2 IVar2;
  ImVec2 IVar3;
  undefined4 uVar4;
  int iVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  short sVar8;
  undefined4 uVar9;
  ImVec2 *pIVar10;
  ulong uVar11;
  int iVar12;
  long in_R8;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar21;
  undefined1 auVar20 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  
  iVar5 = (GImGui->PlatformIO).Monitors.Size;
  if ((long)iVar5 < 2) {
    sVar8 = (short)iVar5 + -1;
  }
  else {
    IVar2 = (viewport->super_ImGuiViewport).Pos;
    fVar13 = IVar2.x;
    fVar14 = IVar2.y;
    IVar3 = (viewport->super_ImGuiViewport).Size;
    fVar15 = IVar3.x + fVar13;
    fVar16 = IVar3.y + fVar14;
    fVar17 = (fVar16 - fVar14) * (fVar15 - fVar13) * 0.5;
    if (fVar17 <= 1.0) {
      fVar17 = 1.0;
    }
    uVar9 = 0xffffffff;
    sVar8 = -1;
    if (0.001 < fVar17) {
      pIVar10 = &((GImGui->PlatformIO).Monitors.Data)->MainSize;
      fVar18 = 0.001;
      uVar11 = 1;
      do {
        uVar1 = pIVar10[-1].x;
        uVar4 = pIVar10[-1].y;
        fVar19 = (*pIVar10).x + (float)uVar1;
        fVar21 = (*pIVar10).y + (float)uVar4;
        auVar20._0_8_ = CONCAT44(fVar21,fVar19);
        auVar20._8_8_ = 0;
        auVar23._4_4_ = -(uint)(fVar16 <= fVar21);
        auVar23._0_4_ = -(uint)(fVar15 <= fVar19);
        auVar23._8_4_ = -(uint)((float)uVar1 <= fVar13);
        auVar23._12_4_ = -(uint)((float)uVar4 <= fVar14);
        iVar12 = movmskps((int)in_R8,auVar23);
        if (iVar12 == 0xf) {
          sVar8 = (short)uVar11 + -1;
          break;
        }
        in_R8 = uVar11 - 1;
        auVar22._8_8_ = 0;
        auVar22._0_8_ = auVar20._0_8_;
        auVar6._8_8_ = 0;
        auVar6._0_4_ = IVar2.x;
        auVar6._4_4_ = IVar2.y;
        auVar23 = minps(auVar22,auVar6);
        auVar7._4_4_ = fVar16;
        auVar7._0_4_ = fVar15;
        auVar7._8_8_ = 0;
        auVar20 = minps(auVar20,auVar7);
        fVar19 = ((float)(~-(uint)(fVar16 < (float)uVar4) & auVar20._4_4_ |
                         uVar4 & -(uint)(fVar16 < (float)uVar4)) -
                 (float)(~-(uint)(fVar14 < (float)uVar4) & auVar23._4_4_ |
                        uVar4 & -(uint)(fVar14 < (float)uVar4))) *
                 ((float)(~-(uint)(fVar15 < (float)uVar1) & auVar20._0_4_ |
                         uVar1 & -(uint)(fVar15 < (float)uVar1)) -
                 (float)(~-(uint)(fVar13 < (float)uVar1) & auVar23._0_4_ |
                        uVar1 & -(uint)(fVar13 < (float)uVar1)));
        if (fVar18 <= fVar19) {
          uVar9 = (int)in_R8;
        }
        sVar8 = (short)uVar9;
        if ((ulong)(long)iVar5 <= uVar11) break;
        if (fVar18 <= fVar19) {
          fVar18 = fVar19;
        }
        uVar11 = uVar11 + 1;
        pIVar10 = (ImVec2 *)&pIVar10[4].y;
      } while (fVar18 < fVar17);
    }
  }
  viewport->PlatformMonitor = sVar8;
  return;
}

Assistant:

static int ImGui::FindPlatformMonitorForRect(const ImRect& rect)
{
    ImGuiContext& g = *GImGui;

    const int monitor_count = g.PlatformIO.Monitors.Size;
    if (monitor_count <= 1)
        return monitor_count - 1;

    // Use a minimum threshold of 1.0f so a zero-sized rect won't false positive, and will still find the correct monitor given its position.
    // This is necessary for tooltips which always resize down to zero at first.
    const float surface_threshold = ImMax(rect.GetWidth() * rect.GetHeight() * 0.5f, 1.0f);
    int best_monitor_n = -1;
    float best_monitor_surface = 0.001f;

    for (int monitor_n = 0; monitor_n < g.PlatformIO.Monitors.Size && best_monitor_surface < surface_threshold; monitor_n++)
    {
        const ImGuiPlatformMonitor& monitor = g.PlatformIO.Monitors[monitor_n];
        const ImRect monitor_rect = ImRect(monitor.MainPos, monitor.MainPos + monitor.MainSize);
        if (monitor_rect.Contains(rect))
            return monitor_n;
        ImRect overlapping_rect = rect;
        overlapping_rect.ClipWithFull(monitor_rect);
        float overlapping_surface = overlapping_rect.GetWidth() * overlapping_rect.GetHeight();
        if (overlapping_surface < best_monitor_surface)
            continue;
        best_monitor_surface = overlapping_surface;
        best_monitor_n = monitor_n;
    }
    return best_monitor_n;
}